

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::GenerateSerializedSizeCode
          (ImmutablePrimitiveOneofFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  JavaType JVar1;
  char *pcVar2;
  size_t sVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  vars = &(this->super_ImmutablePrimitiveFieldGenerator).variables_;
  text_00._M_str =
       "if ($has_oneof_case_message$) {\n  size += com.google.protobuf.CodedOutputStream\n    .compute$capitalized_type$Size(\n"
  ;
  text_00._M_len = 0x74;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  JVar1 = GetJavaType((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  if (JVar1 == JAVATYPE_BYTES) {
    pcVar2 = "        $number$, ($type$) $oneof_name$_);\n";
    sVar3 = 0x2b;
  }
  else {
    pcVar2 = "        $number$, ($type$)(($boxed_type$) $oneof_name$_));\n";
    sVar3 = 0x3b;
  }
  text_01._M_str = pcVar2;
  text_01._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  text._M_str = "}\n";
  text._M_len = 2;
  io::Printer::Print<>(printer,text);
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldGenerator::GenerateSerializedSizeCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "if ($has_oneof_case_message$) {\n"
                 "  size += com.google.protobuf.CodedOutputStream\n"
                 "    .compute$capitalized_type$Size(\n");
  // $type$ and $boxed_type$ is the same for bytes fields so we don't need to
  // do redundant casts.
  if (GetJavaType(descriptor_) == JAVATYPE_BYTES) {
    printer->Print(variables_, "        $number$, ($type$) $oneof_name$_);\n");
  } else {
    printer->Print(
        variables_,
        "        $number$, ($type$)(($boxed_type$) $oneof_name$_));\n");
  }
  printer->Print("}\n");
}